

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

float __thiscall
tcu::ConstPixelBufferAccess::sample2DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,float t
          ,IVec3 *offset)

{
  WrapMode WVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  WrapMode WVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  TextureChannelClass TVar11;
  TextureChannelClass TVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined4 in_XMM0_Db;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float fVar26;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined1 in_register_00001284 [12];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar54;
  undefined1 auVar53 [16];
  float fVar55;
  Vector<float,_4> res_4;
  Vec4 p01Clr;
  Vec4 p10Clr;
  Vec4 p00Clr;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  TextureFormat local_b8;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ConstPixelBufferAccess local_58;
  undefined1 auVar30 [16];
  
  uVar32 = in_register_00001284._4_8_;
  local_58.m_size.m_data[2] = (int)ref;
  local_58.m_pitch.m_data[0] = in_XMM0_Db;
  TVar11 = getTextureChannelClass((this->m_format).type);
  if (sampler->normalizedCoords == true) {
    WVar1 = sampler->wrapS;
    auVar35 = ZEXT816(0);
    if (WVar1 < WRAPMODE_LAST) {
      fVar26 = (float)(this->m_size).m_data[0];
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar24 = floorf(s);
          auVar10._4_4_ = in_XMM1_Db;
          auVar10._0_4_ = s;
          auVar10._8_4_ = in_XMM1_Dc;
          auVar10._12_4_ = in_XMM1_Dd;
          auVar27._4_12_ = auVar10._4_12_;
          auVar27._0_4_ = s - fVar24;
        }
        else {
          local_98._0_4_ = s * 0.5;
          fVar24 = floorf(s * 0.5);
          if (((float)local_98._0_4_ - fVar24 != 0.5) || (NAN((float)local_98._0_4_ - fVar24))) {
            fVar24 = floorf((float)local_98._0_4_ + 0.5);
            auVar44._4_4_ = extraout_var._0_4_;
            auVar44._0_4_ = fVar24;
            auVar44._8_4_ = extraout_var._4_4_;
            auVar44._12_4_ = extraout_var._8_4_;
          }
          else {
            fVar24 = 0.0;
            if (((long)((float)local_98._0_4_ + -0.5) & 1U) != 0) {
              fVar24 = 1.0;
            }
            auVar44 = ZEXT416((uint)((float)local_98._0_4_ + -0.5 + fVar24));
          }
          in_XMM3_Qa = auVar44._8_8_;
          fVar24 = s - (auVar44._0_4_ + auVar44._0_4_);
          uVar15 = -(uint)(-fVar24 <= fVar24);
          auVar33._0_4_ = (uint)fVar24 & uVar15;
          auVar33._4_4_ = in_XMM1_Db & (in_XMM1_Db ^ 0x80000000);
          auVar33._8_4_ = in_XMM1_Dc & (in_XMM1_Dc ^ 0x80000000);
          auVar33._12_4_ = in_XMM1_Dd & (in_XMM1_Dd ^ 0x80000000);
          uVar32 = auVar33._8_8_;
          auVar27 = ZEXT416(~uVar15 & (uint)-fVar24) | auVar33;
        }
        auVar35._4_12_ = auVar27._4_12_;
        auVar35._0_4_ = auVar27._0_4_ * fVar26;
      }
      else {
        auVar35 = ZEXT416((uint)(fVar26 * s));
      }
    }
    WVar1 = sampler->wrapT;
    uStack_bc = in_register_00001284._8_4_;
    if (WVar1 < WRAPMODE_LAST) {
      fVar26 = (float)(this->m_size).m_data[1];
      uVar32 = 0;
      uStack_c4 = in_register_00001284._0_4_;
      uStack_c0 = in_register_00001284._4_4_;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        local_98 = auVar35;
        if (WVar1 == REPEAT_CL) {
          uVar32 = 0;
          fVar24 = floorf(t);
          fVar24 = t - fVar24;
        }
        else {
          fVar24 = t * 0.5;
          fVar25 = floorf(fVar24);
          if ((fVar24 - fVar25 != 0.5) || (NAN(fVar24 - fVar25))) {
            fVar24 = floorf(fVar24 + 0.5);
            auVar45._4_4_ = extraout_var_00._0_4_;
            auVar45._0_4_ = fVar24;
            auVar45._8_4_ = extraout_var_00._4_4_;
            auVar45._12_4_ = extraout_var_00._8_4_;
          }
          else {
            fVar25 = 0.0;
            if (((long)(fVar24 + -0.5) & 1U) != 0) {
              fVar25 = 1.0;
            }
            auVar45 = ZEXT416((uint)(fVar24 + -0.5 + fVar25));
          }
          in_XMM3_Qa = auVar45._8_8_;
          fVar24 = t - (auVar45._0_4_ + auVar45._0_4_);
          uVar15 = -(uint)(-fVar24 <= fVar24);
          auVar34._0_4_ = (uint)fVar24 & uVar15;
          auVar34._4_4_ = uStack_c4 & (uStack_c4 ^ 0x80000000);
          auVar34._8_4_ = uStack_c0 & (uStack_c0 ^ 0x80000000);
          auVar34._12_4_ = uStack_bc & (uStack_bc ^ 0x80000000);
          uVar32 = auVar34._8_8_;
          fVar24 = (float)(~uVar15 & (uint)-fVar24 | auVar34._0_4_);
        }
        t = fVar24 * fVar26;
        auVar35 = local_98;
      }
      else {
        t = t * fVar26;
      }
    }
    else {
      t = 0.0;
    }
  }
  else {
    auVar35._4_4_ = in_XMM1_Db;
    auVar35._0_4_ = s;
    auVar35._8_4_ = in_XMM1_Dc;
    auVar35._12_4_ = in_XMM1_Dd;
  }
  auVar29._4_12_ = auVar35._4_12_;
  if (filter != LINEAR) {
    if (filter != NEAREST) {
      return 0.0;
    }
    sampleNearest2D((tcu *)&local_b8,this,sampler,auVar35._0_4_,t,offset);
    auVar28._0_8_ = CONCAT44(local_58.m_size.m_data[2],(&local_b8.order)[sampler->compareChannel]);
    auVar28._8_4_ = 0;
    auVar28._12_4_ = local_58.m_pitch.m_data[0];
    if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      auVar35 = minps(_DAT_00942920,auVar28);
      auVar28._0_8_ =
           CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar35._4_4_,
                    -(uint)(0.0 <= (float)(&local_b8.order)[sampler->compareChannel]) &
                    auVar35._0_4_);
    }
    fVar26 = (float)auVar28._0_8_;
    fVar24 = (float)(auVar28._0_8_ >> 0x20);
    switch(sampler->compare) {
    case COMPAREMODE_LESS:
      if (fVar26 <= fVar24) {
        return 0.0;
      }
      break;
    case COMPAREMODE_LESS_OR_EQUAL:
      if (fVar26 < fVar24) {
        return 0.0;
      }
      break;
    case COMPAREMODE_GREATER:
      if (fVar24 <= fVar26) {
        return 0.0;
      }
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      if (fVar24 < fVar26) {
        return 0.0;
      }
      break;
    case COMPAREMODE_EQUAL:
      if (fVar24 != fVar26) {
        return 0.0;
      }
      if (NAN(fVar24) || NAN(fVar26)) {
        return 0.0;
      }
      break;
    case COMPAREMODE_NOT_EQUAL:
      if ((fVar24 == fVar26) && (!NAN(fVar24) && !NAN(fVar26))) {
        return 0.0;
      }
      break;
    case COMPAREMODE_ALWAYS:
      break;
    default:
      return 0.0;
    }
    return 1.0;
  }
  uVar2 = (this->m_size).m_data[0];
  uVar3 = (this->m_size).m_data[1];
  auVar29._0_4_ = auVar35._0_4_ + -0.5;
  local_98 = auVar29;
  local_9c = floorf(auVar29._0_4_);
  iVar20 = (int)local_9c;
  iVar13 = offset->m_data[0];
  iVar4 = offset->m_data[1];
  uVar15 = iVar13 + 1 + iVar20;
  local_a0 = floorf(t + -0.5);
  WVar1 = sampler->wrapS;
  local_a4 = 0;
  if (MIRRORED_ONCE < WVar1) goto LAB_008fa34d;
  uVar18 = iVar13 + iVar20;
  switch(WVar1) {
  case CLAMP_TO_EDGE:
    uVar17 = uVar2 - 1;
    local_a4 = uVar17;
    if ((int)uVar18 < (int)uVar17) {
      local_a4 = uVar18;
    }
    if ((int)uVar18 < 0) {
      local_a4 = 0;
    }
    if ((int)uVar15 < (int)uVar17) {
      uVar17 = uVar15;
    }
    if ((int)uVar15 < 0) {
      uVar17 = 0;
    }
    break;
  case CLAMP_TO_BORDER:
    local_a4 = uVar2;
    if ((int)uVar18 < (int)uVar2) {
      local_a4 = uVar18;
    }
    if ((int)uVar18 < -1) {
      local_a4 = 0xffffffff;
    }
    uVar17 = uVar2;
    if ((int)uVar15 < (int)uVar2) {
      uVar17 = uVar15;
    }
    if ((int)uVar15 < -1) {
      uVar17 = 0xffffffff;
    }
    break;
  default:
    local_a4 = ((int)uVar18 % (int)uVar2 >> 0x1f & uVar2) + (int)uVar18 % (int)uVar2;
    uVar17 = ((int)uVar15 % (int)uVar2 >> 0x1f & uVar2) + (int)uVar15 % (int)uVar2;
    break;
  case MIRRORED_REPEAT_GL:
    uVar17 = uVar18;
    goto LAB_008fa329;
  case MIRRORED_REPEAT_CL:
    uVar17 = uVar2 - 1;
    if ((int)uVar18 < (int)(uVar2 - 1)) {
      uVar17 = uVar18;
    }
    local_a4 = 0;
    if (-1 < (int)uVar18) {
      local_a4 = uVar17;
    }
    goto LAB_008fa36c;
  case MIRRORED_ONCE:
    uVar17 = uVar2;
    if ((int)uVar18 < (int)uVar2) {
      uVar17 = uVar18;
    }
    if (SBORROW4(uVar18,-uVar2) != (int)(uVar18 + uVar2) < 0) {
      uVar17 = -uVar2;
    }
LAB_008fa329:
    iVar13 = (int)uVar17 % (int)(uVar2 * 2);
    uVar18 = (iVar13 - uVar2) + (iVar13 >> 0x1f & uVar2 * 2);
    local_a4 = ~((int)uVar18 >> 0x1f ^ uVar18) + uVar2;
LAB_008fa34d:
    uVar18 = uVar15;
    if (WVar1 != MIRRORED_REPEAT_GL) {
      if (WVar1 != MIRRORED_ONCE) {
        uVar17 = 0;
        if (WVar1 == MIRRORED_REPEAT_CL) {
LAB_008fa36c:
          uVar18 = uVar2 - 1;
          if ((int)uVar15 < (int)(uVar2 - 1)) {
            uVar18 = uVar15;
          }
          uVar17 = 0;
          if (-1 < (int)uVar15) {
            uVar17 = uVar18;
          }
        }
        break;
      }
      uVar18 = uVar2;
      if ((int)uVar15 < (int)uVar2) {
        uVar18 = uVar15;
      }
      if (SBORROW4(uVar15,-uVar2) != (int)(uVar15 + uVar2) < 0) {
        uVar18 = -uVar2;
      }
    }
    iVar13 = (int)uVar18 % (int)(uVar2 * 2);
    uVar15 = (iVar13 - uVar2) + (iVar13 >> 0x1f & uVar2 * 2);
    uVar17 = ~((int)uVar15 >> 0x1f ^ uVar15) + uVar2;
  }
  uVar18 = (int)local_a0 + iVar4 + 1;
  WVar5 = sampler->wrapT;
  uVar15 = 0;
  if (WVar5 < WRAPMODE_LAST) {
    uVar16 = iVar4 + (int)local_a0;
    uVar15 = uVar16;
    switch(WVar5) {
    case CLAMP_TO_EDGE:
      uVar19 = uVar3 - 1;
      uVar15 = uVar19;
      if ((int)uVar16 < (int)uVar19) {
        uVar15 = uVar16;
      }
      if ((int)uVar16 < 0) {
        uVar15 = 0;
      }
      if ((int)uVar18 < (int)uVar19) {
        uVar19 = uVar18;
      }
      if ((int)uVar18 < 0) {
        uVar19 = 0;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar15 = uVar3;
      if ((int)uVar16 < (int)uVar3) {
        uVar15 = uVar16;
      }
      if ((int)uVar16 < -1) {
        uVar15 = 0xffffffff;
      }
      uVar19 = uVar3;
      if ((int)uVar18 < (int)uVar3) {
        uVar19 = uVar18;
      }
      if ((int)uVar18 < -1) {
        uVar19 = 0xffffffff;
      }
      break;
    default:
      uVar15 = ((int)uVar16 % (int)uVar3 >> 0x1f & uVar3) + (int)uVar16 % (int)uVar3;
      uVar19 = ((int)uVar18 % (int)uVar3 >> 0x1f & uVar3) + (int)uVar18 % (int)uVar3;
      break;
    case MIRRORED_REPEAT_CL:
      uVar19 = uVar3 - 1;
      if ((int)uVar16 < (int)(uVar3 - 1)) {
        uVar19 = uVar16;
      }
      uVar15 = 0;
      if (-1 < (int)uVar16) {
        uVar15 = uVar19;
      }
LAB_008fa4c8:
      uVar16 = uVar3 - 1;
      if ((int)uVar18 < (int)(uVar3 - 1)) {
        uVar16 = uVar18;
      }
      uVar19 = 0;
      if (-1 < (int)uVar18) {
        uVar19 = uVar16;
      }
      break;
    case MIRRORED_ONCE:
      uVar15 = uVar3;
      if ((int)uVar16 < (int)uVar3) {
        uVar15 = uVar16;
      }
      if (SBORROW4(uVar16,-uVar3) != (int)(uVar16 + uVar3) < 0) {
        uVar15 = -uVar3;
      }
    case MIRRORED_REPEAT_GL:
      iVar13 = (int)uVar15 % (int)(uVar3 * 2);
      uVar15 = (iVar13 - uVar3) + (iVar13 >> 0x1f & uVar3 * 2);
      uVar15 = ~((int)uVar15 >> 0x1f ^ uVar15) + uVar3;
      goto LAB_008fa4b5;
    }
  }
  else {
LAB_008fa4b5:
    uVar16 = uVar18;
    if (WVar5 != MIRRORED_REPEAT_GL) {
      if (WVar5 != MIRRORED_ONCE) {
        uVar19 = 0;
        if (WVar5 == MIRRORED_REPEAT_CL) goto LAB_008fa4c8;
        goto LAB_008fa514;
      }
      uVar16 = uVar3;
      if ((int)uVar18 < (int)uVar3) {
        uVar16 = uVar18;
      }
      if (SBORROW4(uVar18,-uVar3) != (int)(uVar18 + uVar3) < 0) {
        uVar16 = -uVar3;
      }
    }
    iVar13 = (int)uVar16 % (int)(uVar3 * 2);
    uVar18 = (iVar13 - uVar3) + (iVar13 >> 0x1f & uVar3 * 2);
    uVar19 = ~((int)uVar18 >> 0x1f ^ uVar18) + uVar3;
  }
LAB_008fa514:
  bVar21 = WVar1 != CLAMP_TO_BORDER;
  bVar23 = -1 < (int)local_a4;
  bVar6 = (int)local_a4 < (int)uVar2;
  bVar22 = WVar5 != CLAMP_TO_BORDER;
  iVar13 = (int)this;
  if ((bVar21 || bVar6 && bVar23) && (bVar22 || (int)uVar15 < (int)uVar3 && -1 < (int)uVar15)) {
    lookup((ConstPixelBufferAccess *)(local_68 + 0x10),iVar13,local_a4,uVar15);
  }
  else {
    TVar12 = getTextureChannelClass((this->m_format).type);
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)(local_68 + 0x10),(Sampler *)this);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_b8,(Sampler *)this);
      local_58.m_format.order = (ChannelOrder)(float)(int)local_b8.order;
      local_58.m_format.type = (ChannelType)(float)(int)local_b8.type;
      local_58.m_size.m_data[0] = (int)(float)(int)uStack_b0;
      local_58.m_size.m_data[1] = (int)(float)(int)uStack_ac;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_b8,(Sampler *)this);
      local_58.m_format.order =
           (ChannelOrder)
           (((float)(local_b8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_b8.order & 0xffff | 0x4b000000));
      local_58.m_format.type =
           (ChannelType)
           (((float)(local_b8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_b8.type & 0xffff | 0x4b000000));
      local_58.m_size.m_data[0] =
           (int)(((float)(uStack_b0 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uStack_b0 & 0xffff | 0x4b000000));
      local_58.m_size.m_data[1] =
           (int)(((float)(uStack_ac >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uStack_ac & 0xffff | 0x4b000000));
      break;
    default:
      local_58.m_format.order = 0xbf800000;
      local_58.m_format.type = 0xbf800000;
      local_58.m_size.m_data[0] = -0x40800000;
      local_58.m_size.m_data[1] = -0x40800000;
    }
  }
  if ((bVar22 || (int)uVar15 < (int)uVar3 && -1 < (int)uVar15) &&
      (bVar21 || (int)uVar17 < (int)uVar2 && -1 < (int)uVar17)) {
    lookup((ConstPixelBufferAccess *)local_68,iVar13,uVar17,uVar15);
    goto LAB_008fa734;
  }
  TVar12 = getTextureChannelClass((this->m_format).type);
  switch(TVar12) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((TextureFormat *)local_68,(Sampler *)this);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>(&local_b8,(Sampler *)this);
    local_68._0_4_ = (undefined4)(int)local_b8.order;
    local_68._4_4_ = (undefined4)(int)local_b8.type;
    local_68._8_4_ = (undefined4)(int)uStack_b0;
    local_68._12_4_ = (undefined4)(int)uStack_ac;
    goto LAB_008fa72c;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>(&local_b8,(Sampler *)this);
    local_68._0_4_ =
         ((float)(local_b8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_b8.order & 0xffff | 0x4b000000);
    local_68._4_4_ =
         ((float)(local_b8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_b8.type & 0xffff | 0x4b000000);
    local_68._8_4_ =
         ((float)(uStack_b0 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_b0 & 0xffff | 0x4b000000);
    local_68._12_4_ =
         ((float)(uStack_ac >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_ac & 0xffff | 0x4b000000);
LAB_008fa72c:
    break;
  default:
    local_68._0_4_ = 0xbf800000;
    local_68._4_4_ = 0xbf800000;
    local_68._8_4_ = -0x40800000;
    local_68._12_4_ = -0x40800000;
  }
LAB_008fa734:
  if ((bVar21 || bVar6 && bVar23) && (bVar22 || (int)uVar19 < (int)uVar3 && -1 < (int)uVar19)) {
    lookup((ConstPixelBufferAccess *)local_78,iVar13,local_a4,uVar19);
  }
  else {
    TVar12 = getTextureChannelClass((this->m_format).type);
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_78,(Sampler *)this);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_b8,(Sampler *)this);
      local_78._0_4_ = (undefined4)(int)local_b8.order;
      local_78._4_4_ = (undefined4)(int)local_b8.type;
      local_78._8_4_ = (undefined4)(int)uStack_b0;
      local_78._12_4_ = (undefined4)(int)uStack_ac;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_b8,(Sampler *)this);
      local_78._0_4_ =
           ((float)(local_b8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_b8.order & 0xffff | 0x4b000000);
      local_78._4_4_ =
           ((float)(local_b8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_b8.type & 0xffff | 0x4b000000);
      local_78._8_4_ =
           ((float)(uStack_b0 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_b0 & 0xffff | 0x4b000000);
      local_78._12_4_ =
           ((float)(uStack_ac >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_ac & 0xffff | 0x4b000000);
      break;
    default:
      local_78._0_4_ = -1.0;
      local_78._4_4_ = -1.0;
      local_78._8_4_ = -1.0;
      local_78._12_4_ = -1.0;
    }
  }
  if ((bVar21 || (int)uVar17 < (int)uVar2 && -1 < (int)uVar17) &&
      (bVar22 || (int)uVar19 < (int)uVar3 && -1 < (int)uVar19)) {
    lookup((ConstPixelBufferAccess *)local_88,iVar13,uVar17,uVar19);
    goto LAB_008fa8f2;
  }
  TVar12 = getTextureChannelClass((this->m_format).type);
  switch(TVar12) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((TextureFormat *)local_88,(Sampler *)this);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>(&local_b8,(Sampler *)this);
    local_88._0_4_ = (undefined4)(int)local_b8.order;
    local_88._4_4_ = (undefined4)(int)local_b8.type;
    local_88._8_4_ = (undefined4)(int)uStack_b0;
    local_88._12_4_ = (undefined4)(int)uStack_ac;
    goto LAB_008fa8ed;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>(&local_b8,(Sampler *)this);
    local_88._0_4_ =
         ((float)(local_b8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_b8.order & 0xffff | 0x4b000000);
    local_88._4_4_ =
         ((float)(local_b8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_b8.type & 0xffff | 0x4b000000);
    local_88._8_4_ =
         ((float)(uStack_b0 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_b0 & 0xffff | 0x4b000000);
    local_88._12_4_ =
         ((float)(uStack_ac >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_ac & 0xffff | 0x4b000000);
LAB_008fa8ed:
    break;
  default:
    local_88._0_4_ = 0xbf800000;
    local_88._4_4_ = 0xbf800000;
    local_88._8_4_ = -0x40800000;
    local_88._12_4_ = -0x40800000;
  }
LAB_008fa8f2:
  lVar14 = (long)sampler->compareChannel;
  fVar26 = *(float *)(local_68 + lVar14 * 4 + 0x10);
  auVar31._4_8_ = 0;
  auVar31._0_4_ = fVar26;
  auVar31._12_4_ = local_58.m_pitch.m_data[0];
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._0_8_ = CONCAT44(local_58.m_size.m_data[2],fVar26);
  if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar35 = minps(_DAT_00942920,auVar30);
    uVar32 = auVar35._8_8_;
    auVar30._0_8_ =
         CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar35._4_4_,
                  -(uint)(0.0 <= fVar26) & auVar35._0_4_);
  }
  fVar26 = 0.0;
  iVar13 = sampler->compare - COMPAREMODE_LESS;
  fVar24 = (float)auVar30._0_8_;
  fVar25 = (float)((ulong)auVar30._0_8_ >> 0x20);
  switch(iVar13) {
  case 0:
    auVar36._4_4_ = fVar25;
    auVar36._0_4_ = fVar25;
    auVar36._8_4_ = fVar25;
    auVar36._12_4_ = fVar25;
    uVar32 = auVar36._8_8_;
    if (fVar25 < fVar24) goto switchD_008fa943_caseD_6;
    break;
  case 1:
    auVar38._4_4_ = fVar25;
    auVar38._0_4_ = fVar25;
    auVar38._8_4_ = fVar25;
    auVar38._12_4_ = fVar25;
    uVar32 = auVar38._8_8_;
    if (fVar25 <= fVar24) goto switchD_008fa943_caseD_6;
    break;
  case 2:
    auVar39._4_4_ = fVar25;
    auVar39._0_4_ = fVar25;
    auVar39._8_4_ = fVar25;
    auVar39._12_4_ = fVar25;
    uVar32 = auVar39._8_8_;
    if (fVar24 < fVar25) goto switchD_008fa943_caseD_6;
    break;
  case 3:
    auVar37._4_4_ = fVar25;
    auVar37._0_4_ = fVar25;
    auVar37._8_4_ = fVar25;
    auVar37._12_4_ = fVar25;
    uVar32 = auVar37._8_8_;
    if (fVar24 <= fVar25) goto switchD_008fa943_caseD_6;
    break;
  case 4:
    auVar40._4_4_ = fVar25;
    auVar40._0_4_ = fVar25;
    auVar40._8_4_ = fVar25;
    auVar40._12_4_ = fVar25;
    uVar32 = auVar40._8_8_;
    if ((fVar25 == fVar24) && (!NAN(fVar25) && !NAN(fVar24))) goto switchD_008fa943_caseD_6;
    break;
  case 5:
    auVar43._4_4_ = fVar25;
    auVar43._0_4_ = fVar25;
    auVar43._8_4_ = fVar25;
    auVar43._12_4_ = fVar25;
    uVar32 = auVar43._8_8_;
    if ((fVar25 != fVar24) || (NAN(fVar25) || NAN(fVar24))) goto switchD_008fa943_caseD_6;
    break;
  case 6:
switchD_008fa943_caseD_6:
    fVar26 = 1.0;
  }
  auVar8._4_8_ = uVar32;
  auVar8._0_4_ = local_58.m_size.m_data[2];
  auVar41._0_8_ = auVar8._0_8_ << 0x20;
  auVar41._8_4_ = local_58.m_size.m_data[2];
  auVar41._12_4_ = local_58.m_size.m_data[2];
  auVar42._4_12_ = auVar41._4_12_;
  auVar42._0_4_ = *(float *)(local_68 + lVar14 * 4);
  uVar32 = auVar42._0_8_;
  if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar35 = minps(_DAT_00942920,auVar42);
    in_XMM3_Qa = auVar35._8_8_;
    uVar32 = CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar35._4_4_,
                      -(uint)(0.0 <= *(float *)(local_68 + lVar14 * 4)) & auVar35._0_4_);
  }
  fVar24 = 0.0;
  fVar25 = (float)uVar32;
  fVar55 = (float)((ulong)uVar32 >> 0x20);
  switch(iVar13) {
  case 0:
    auVar46._4_4_ = fVar55;
    auVar46._0_4_ = fVar55;
    auVar46._8_4_ = fVar55;
    auVar46._12_4_ = fVar55;
    in_XMM3_Qa = auVar46._8_8_;
    if (fVar55 < fVar25) goto switchD_008fa9d2_caseD_6;
    break;
  case 1:
    auVar48._4_4_ = fVar55;
    auVar48._0_4_ = fVar55;
    auVar48._8_4_ = fVar55;
    auVar48._12_4_ = fVar55;
    in_XMM3_Qa = auVar48._8_8_;
    if (fVar55 <= fVar25) goto switchD_008fa9d2_caseD_6;
    break;
  case 2:
    auVar49._4_4_ = fVar55;
    auVar49._0_4_ = fVar55;
    auVar49._8_4_ = fVar55;
    auVar49._12_4_ = fVar55;
    in_XMM3_Qa = auVar49._8_8_;
    if (fVar25 < fVar55) goto switchD_008fa9d2_caseD_6;
    break;
  case 3:
    auVar47._4_4_ = fVar55;
    auVar47._0_4_ = fVar55;
    auVar47._8_4_ = fVar55;
    auVar47._12_4_ = fVar55;
    in_XMM3_Qa = auVar47._8_8_;
    if (fVar25 <= fVar55) goto switchD_008fa9d2_caseD_6;
    break;
  case 4:
    auVar50._4_4_ = fVar55;
    auVar50._0_4_ = fVar55;
    auVar50._8_4_ = fVar55;
    auVar50._12_4_ = fVar55;
    in_XMM3_Qa = auVar50._8_8_;
    if ((fVar55 == fVar25) && (!NAN(fVar55) && !NAN(fVar25))) goto switchD_008fa9d2_caseD_6;
    break;
  case 5:
    auVar53._4_4_ = fVar55;
    auVar53._0_4_ = fVar55;
    auVar53._8_4_ = fVar55;
    auVar53._12_4_ = fVar55;
    in_XMM3_Qa = auVar53._8_8_;
    if ((fVar55 != fVar25) || (NAN(fVar55) || NAN(fVar25))) goto switchD_008fa9d2_caseD_6;
    break;
  case 6:
switchD_008fa9d2_caseD_6:
    fVar24 = 1.0;
  }
  auVar9._4_8_ = in_XMM3_Qa;
  auVar9._0_4_ = local_58.m_size.m_data[2];
  auVar51._0_8_ = auVar9._0_8_ << 0x20;
  auVar51._8_4_ = local_58.m_size.m_data[2];
  auVar51._12_4_ = local_58.m_size.m_data[2];
  auVar52._4_12_ = auVar51._4_12_;
  auVar52._0_4_ = *(float *)(local_78 + lVar14 * 4);
  uVar32 = auVar52._0_8_;
  if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar35 = minps(_DAT_00942920,auVar52);
    uVar32 = CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar35._4_4_,
                      -(uint)(0.0 <= *(float *)(local_78 + lVar14 * 4)) & auVar35._0_4_);
  }
  fVar25 = 0.0;
  fVar55 = (float)uVar32;
  fVar54 = (float)((ulong)uVar32 >> 0x20);
  switch(iVar13) {
  case 0:
    if (fVar54 < fVar55) goto switchD_008faa61_caseD_6;
    break;
  case 1:
    if (fVar54 <= fVar55) goto switchD_008faa61_caseD_6;
    break;
  case 2:
    if (fVar55 < fVar54) goto switchD_008faa61_caseD_6;
    break;
  case 3:
    if (fVar55 <= fVar54) goto switchD_008faa61_caseD_6;
    break;
  case 4:
    if ((fVar54 == fVar55) && (!NAN(fVar54) && !NAN(fVar55))) goto switchD_008faa61_caseD_6;
    break;
  case 5:
    if ((fVar54 != fVar55) || (NAN(fVar54) || NAN(fVar55))) goto switchD_008faa61_caseD_6;
    break;
  case 6:
switchD_008faa61_caseD_6:
    fVar25 = 1.0;
  }
  fVar55 = *(float *)(local_88 + lVar14 * 4);
  if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar7._4_4_ = local_58.m_size.m_data[2];
    auVar7._0_4_ = fVar55;
    auVar7._8_4_ = local_58.m_size.m_data[2];
    auVar7._12_4_ = local_58.m_size.m_data[2];
    auVar35 = minps(_DAT_00942920,auVar7);
    fVar55 = (float)(-(uint)(0.0 <= fVar55) & auVar35._0_4_);
    local_58.m_size.m_data[2] = -(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar35._4_4_;
  }
  fVar54 = 0.0;
  switch(iVar13) {
  case 0:
    if (fVar55 <= (float)local_58.m_size.m_data[2]) goto switchD_008faaea_default;
    break;
  case 1:
    if (fVar55 < (float)local_58.m_size.m_data[2]) goto switchD_008faaea_default;
    break;
  case 2:
    if ((float)local_58.m_size.m_data[2] <= fVar55) goto switchD_008faaea_default;
    break;
  case 3:
    if ((float)local_58.m_size.m_data[2] < fVar55) goto switchD_008faaea_default;
    break;
  case 4:
    if (((float)local_58.m_size.m_data[2] != fVar55) ||
       (NAN((float)local_58.m_size.m_data[2]) || NAN(fVar55))) goto switchD_008faaea_default;
    break;
  case 5:
    if (((float)local_58.m_size.m_data[2] == fVar55) &&
       (!NAN((float)local_58.m_size.m_data[2]) && !NAN(fVar55))) goto switchD_008faaea_default;
    break;
  case 6:
    break;
  default:
    goto switchD_008faaea_default;
  }
  fVar54 = 1.0;
switchD_008faaea_default:
  local_a0 = (t + -0.5) - local_a0;
  local_9c = (float)local_98._0_4_ - local_9c;
  return local_9c * fVar54 * local_a0 +
         (1.0 - local_9c) * fVar25 * local_a0 +
         (1.0 - local_a0) * fVar26 * (1.0 - local_9c) + fVar24 * local_9c * (1.0 - local_a0);
}

Assistant:

float ConstPixelBufferAccess::sample2DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest2D(*this, sampler, u, v, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear2DCompare(*this, sampler, ref, u, v, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}